

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetFixedStepBounds(void *arkode_mem,realtype lb,realtype ub)

{
  int iVar1;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem local_30;
  double local_28;
  double local_18;
  ARKodeMem local_8;
  
  local_28 = lb;
  local_18 = ub;
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetFixedStepBounds",&local_8,&local_30);
  if (iVar1 == 0) {
    if (1.0 < local_28 || local_18 < 1.0) {
      local_28 = 1.0;
      local_18 = 1.5;
    }
    local_30->lbound = local_28;
    local_30->ubound = local_18;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetFixedStepBounds(void *arkode_mem, realtype lb, realtype ub)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetFixedStepBounds",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set allowable interval, otherwise set defaults */
  if ((lb <= ONE) && (ub >= ONE)) {
    hadapt_mem->lbound = lb;
    hadapt_mem->ubound = ub;
  } else {
    hadapt_mem->lbound = HFIXED_LB;
    hadapt_mem->ubound = HFIXED_UB;
  }

  return(ARK_SUCCESS);
}